

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

bool xatlas::internal::param::Solver::LeastSquaresSolver
               (Matrix *A,FullVector *b,FullVector *x,float epsilon)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined1 local_90 [8];
  Matrix AtA;
  FullVector Atb;
  undefined1 local_48 [8];
  Matrix At;
  uint32_t D;
  float epsilon_local;
  FullVector *x_local;
  FullVector *b_local;
  Matrix *A_local;
  
  At.m_array.m_base._20_4_ = epsilon;
  uVar2 = sparse::Matrix::width(A);
  uVar3 = FullVector::dimension(x);
  if (uVar2 != uVar3) {
    __assert_fail("A.width() == x.dimension()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x166d,
                  "static bool xatlas::internal::param::Solver::LeastSquaresSolver(const sparse::Matrix &, const FullVector &, FullVector &, float)"
                 );
  }
  uVar2 = sparse::Matrix::height(A);
  uVar3 = FullVector::dimension(b);
  if (uVar2 == uVar3) {
    uVar2 = sparse::Matrix::height(A);
    uVar3 = sparse::Matrix::width(A);
    if (uVar3 <= uVar2) {
      At.m_array.m_base.capacity = sparse::Matrix::width(A);
      uVar2 = sparse::Matrix::height(A);
      uVar3 = sparse::Matrix::width(A);
      sparse::Matrix::Matrix((Matrix *)local_48,uVar2,uVar3);
      sparse::transpose(A,(Matrix *)local_48);
      FullVector::FullVector((FullVector *)&AtA.m_array.m_base.capacity,At.m_array.m_base.capacity);
      sparse::mult((Matrix *)local_48,b,(FullVector *)&AtA.m_array.m_base.capacity);
      sparse::Matrix::Matrix((Matrix *)local_90,At.m_array.m_base.capacity);
      sparse::mult((Matrix *)local_48,A,(Matrix *)local_90);
      bVar1 = SymmetricSolver((Matrix *)local_90,(FullVector *)&AtA.m_array.m_base.capacity,x,
                              (float)At.m_array.m_base._20_4_);
      sparse::Matrix::~Matrix((Matrix *)local_90);
      FullVector::~FullVector((FullVector *)&AtA.m_array.m_base.capacity);
      sparse::Matrix::~Matrix((Matrix *)local_48);
      return bVar1;
    }
    __assert_fail("A.height() >= A.width()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x166f,
                  "static bool xatlas::internal::param::Solver::LeastSquaresSolver(const sparse::Matrix &, const FullVector &, FullVector &, float)"
                 );
  }
  __assert_fail("A.height() == b.dimension()",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                ,0x166e,
                "static bool xatlas::internal::param::Solver::LeastSquaresSolver(const sparse::Matrix &, const FullVector &, FullVector &, float)"
               );
}

Assistant:

static bool LeastSquaresSolver(const sparse::Matrix &A, const FullVector &b, FullVector &x, float epsilon = 1e-5f)
	{
		XA_DEBUG_ASSERT(A.width() == x.dimension());
		XA_DEBUG_ASSERT(A.height() == b.dimension());
		XA_DEBUG_ASSERT(A.height() >= A.width()); // @@ If height == width we could solve it directly...
		const uint32_t D = A.width();
		sparse::Matrix At(A.height(), A.width());
		sparse::transpose(A, At);
		FullVector Atb(D);
		sparse::mult(At, b, Atb);
		sparse::Matrix AtA(D);
		sparse::mult(At, A, AtA);
		return SymmetricSolver(AtA, Atb, x, epsilon);
	}